

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O3

TValue * luaT_gettm(Table *events,TMS event,TString *ename)

{
  byte bVar1;
  TString *pTVar2;
  TValue *n;
  char *__assertion;
  
  if (ename->tt != '\x04') {
    __assert_fail("key->tt == ((4) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                  ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
  }
  n = &events->node[events->hmask & ename->hash].i_val;
  if ((((Node *)n)->i_key).nk.tt_ == 0x8004) {
    pTVar2 = (TString *)(((Node *)n)->i_key).nk.value_.gc;
    bVar1 = pTVar2->tt;
    if ((bVar1 & 0xf) != 4) {
      __assertion = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
LAB_00127226:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (bVar1 != 4) {
      __assertion = 
      "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
      ;
      goto LAB_00127226;
    }
    if (pTVar2 == ename) goto LAB_001271b6;
  }
  if ((((Node *)n)->i_key).nk.next == 0) {
    n = &luaO_nilobject_;
  }
  else {
    n = luaH_getshortstr_continue(ename,(Node *)n);
  }
LAB_001271b6:
  if (event < TM_ADD) {
    if ((((Node *)n)->i_val).tt_ == 0) {
      events->flags = events->flags | (byte)(1 << (event & (TM_N|TM_SUB)));
      n = (TValue *)0x0;
    }
    return n;
  }
  __assert_fail("event <= TM_EQ",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                ,0x3d,"const TValue *luaT_gettm(Table *, TMS, TString *)");
}

Assistant:

const TValue *luaT_gettm (Table *events, TMS event, TString *ename) {
  const TValue *tm = luaH_getshortstr(events, ename);
  lua_assert(event <= TM_EQ);
  if (ttisnil(tm)) {  /* no tag method? */
    events->flags |= cast_byte(1u<<event);  /* cache this fact */
    return NULL;
  }
  else return tm;
}